

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O1

Vec4 tcu::sampleCubeSeamlessLinear
               (ConstPixelBufferAccess (*faceAccesses) [6],CubeFace baseFace,Sampler *sampler,
               float s,float t,int depth)

{
  int iVar1;
  int i;
  long lVar2;
  undefined4 in_register_0000000c;
  Vec4 (*paVVar3) [4];
  Vec4 (*dst) [4];
  Vector<float,_4> *res_9;
  undefined4 in_register_00000034;
  uint uVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  Vec4 VVar9;
  Vector<float,_4> res_7;
  Vector<float,_4> res_8;
  Vector<float,_4> res_4;
  Vector<float,_4> res_5;
  Vector<float,_4> res_1;
  Vector<float,_4> res_2;
  Vector<float,_4> res;
  Vector<float,_4> res_3;
  Vector<float,_4> res_6;
  Vec4 sampleColors [4];
  float local_108 [28];
  undefined1 local_98 [16];
  float local_88 [8];
  undefined8 local_68;
  undefined8 uStack_60;
  float local_58 [12];
  
  dst = (Vec4 (*) [4])CONCAT44(in_register_0000000c,depth);
  if (*(char *)((*dst)[1].m_data + 2) == '\x01') {
    iVar1 = (*(ConstPixelBufferAccess (*) [6])CONCAT44(in_register_00000034,baseFace))[0].m_size.
            m_data[0];
    fVar6 = (*dst)[0].m_data[0];
    fVar5 = 0.0;
    paVVar3 = dst;
    if ((uint)fVar6 < 7) {
      paVVar3 = (Vec4 (*) [4])0x57;
      fVar5 = (float)iVar1;
      if ((0x57U >> ((uint)fVar6 & 0x1f) & 1) == 0) {
        if (fVar6 == 4.2039e-45) {
          fVar6 = floorf(s);
          fVar5 = (s - fVar6) * fVar5;
        }
        else {
          fVar8 = s * 0.5;
          fVar6 = floorf(fVar8);
          fVar6 = fVar8 - fVar6;
          if ((fVar6 != 0.5) || (NAN(fVar6))) {
            fVar7 = floorf(fVar8 + 0.5);
          }
          else {
            fVar7 = 0.0;
            if (((long)(fVar8 - fVar6) & 1U) != 0) {
              fVar7 = 1.0;
            }
            fVar7 = (fVar8 - fVar6) + fVar7;
          }
          fVar6 = s - (fVar7 + fVar7);
          uVar4 = -(uint)(-fVar6 <= fVar6);
          fVar5 = (float)(~uVar4 & (uint)-fVar6 | (uint)fVar6 & uVar4) * fVar5;
        }
      }
      else {
        fVar5 = fVar5 * s;
      }
    }
    fVar6 = (*dst)[0].m_data[1];
    s = fVar5;
    if ((uint)fVar6 < 7) {
      dst = (Vec4 (*) [4])0x57;
      if ((0x57U >> ((uint)fVar6 & 0x1f) & 1) == 0) {
        if (fVar6 == 4.2039e-45) {
          fVar6 = floorf(t);
          t = (t - fVar6) * (float)iVar1;
        }
        else {
          fVar6 = t * 0.5;
          fVar5 = floorf(fVar6);
          fVar5 = fVar6 - fVar5;
          if ((fVar5 != 0.5) || (NAN(fVar5))) {
            fVar8 = floorf(fVar6 + 0.5);
          }
          else {
            fVar8 = 0.0;
            if (((long)(fVar6 - fVar5) & 1U) != 0) {
              fVar8 = 1.0;
            }
            fVar8 = (fVar6 - fVar5) + fVar8;
          }
          fVar6 = t - (fVar8 + fVar8);
          uVar4 = -(uint)(-fVar6 <= fVar6);
          t = (float)(~uVar4 & (uint)-fVar6 | (uint)fVar6 & uVar4) * (float)iVar1;
        }
      }
      else {
        t = t * (float)iVar1;
      }
    }
    else {
      t = 0.0;
      dst = paVVar3;
    }
  }
  local_58[8] = 0.0;
  local_58[9] = 0.0;
  local_58[10] = 0.0;
  local_58[0xb] = 0.0;
  local_58[4] = 0.0;
  local_58[5] = 0.0;
  local_58[6] = 0.0;
  local_58[7] = 0.0;
  local_58[0] = 0.0;
  local_58[1] = 0.0;
  local_58[2] = 0.0;
  local_58[3] = 0.0;
  local_68 = 0;
  uStack_60 = 0;
  getCubeLinearSamples
            ((ConstPixelBufferAccess (*) [6])CONCAT44(in_register_00000034,baseFace),
             (CubeFace)sampler,s,t,(int)&local_68,dst);
  fVar6 = floorf(s + -0.5);
  fVar6 = (s + -0.5) - fVar6;
  fVar5 = floorf(t + -0.5);
  VVar9.m_data[2] = 1.0 - fVar6;
  local_108[0x18] = 0.0;
  local_108[0x19] = 0.0;
  local_108[0x1a] = 0.0;
  local_108[0x1b] = 0.0;
  lVar2 = 0;
  do {
    local_108[lVar2 + 0x18] = *(float *)((long)&local_68 + lVar2 * 4) * VVar9.m_data[2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  fVar5 = (t + -0.5) - fVar5;
  local_98 = ZEXT416(0);
  lVar2 = 0;
  do {
    *(float *)(local_98 + lVar2 * 4) = local_108[lVar2 + 0x18] * (1.0 - fVar5);
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  local_108[0x10] = 0.0;
  local_108[0x11] = 0.0;
  local_108[0x12] = 0.0;
  local_108[0x13] = 0.0;
  lVar2 = 4;
  do {
    local_108[lVar2 + 0xc] = *(float *)((long)&local_68 + lVar2 * 4) * fVar6;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 8);
  local_108[0x14] = 0.0;
  local_108[0x15] = 0.0;
  local_108[0x16] = 0.0;
  local_108[0x17] = 0.0;
  lVar2 = 0;
  do {
    local_108[lVar2 + 0x14] = local_108[lVar2 + 0x10] * (1.0 - fVar5);
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  local_88[0] = 0.0;
  local_88[1] = 0.0;
  local_88[2] = 0.0;
  local_88[3] = 0.0;
  lVar2 = 0;
  do {
    local_88[lVar2] = *(float *)(local_98 + lVar2 * 4) + local_108[lVar2 + 0x14];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  local_108[8] = 0.0;
  local_108[9] = 0.0;
  local_108[10] = 0.0;
  local_108[0xb] = 0.0;
  lVar2 = 0;
  do {
    local_108[lVar2 + 8] = local_58[lVar2 + 4] * VVar9.m_data[2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  local_108[0xc] = 0.0;
  local_108[0xd] = 0.0;
  local_108[0xe] = 0.0;
  local_108[0xf] = 0.0;
  lVar2 = 0;
  do {
    local_108[lVar2 + 0xc] = local_108[lVar2 + 8] * fVar5;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  local_88[4] = 0.0;
  local_88[5] = 0.0;
  local_88[6] = 0.0;
  local_88[7] = 0.0;
  lVar2 = 0;
  do {
    local_88[lVar2 + 4] = local_88[lVar2] + local_108[lVar2 + 0xc];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  local_108[0] = 0.0;
  local_108[1] = 0.0;
  local_108[2] = 0.0;
  local_108[3] = 0.0;
  lVar2 = 0;
  do {
    local_108[lVar2] = local_58[lVar2 + 8] * fVar6;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  local_108[4] = 0.0;
  local_108[5] = 0.0;
  local_108[6] = 0.0;
  local_108[7] = 0.0;
  lVar2 = 0;
  do {
    local_108[lVar2 + 4] = local_108[lVar2] * fVar5;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  (((ConstPixelBufferAccess *)((long)faceAccesses + 0))->m_format).order = R;
  (((ConstPixelBufferAccess *)((long)faceAccesses + 0))->m_format).type = SNORM_INT8;
  (((ConstPixelBufferAccess *)((long)faceAccesses + 0))->m_size).m_data[0] = 0;
  (((ConstPixelBufferAccess *)((long)faceAccesses + 0))->m_size).m_data[1] = 0;
  lVar2 = 0;
  do {
    VVar9.m_data[0] = local_88[lVar2 + 4] + local_108[lVar2 + 4];
    (*faceAccesses)[0].m_size.m_data[lVar2 + -2] = (int)VVar9.m_data[0];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  VVar9.m_data[1] = 0.0;
  VVar9.m_data[3] = 0.0;
  return (Vec4)VVar9.m_data;
}

Assistant:

static Vec4 sampleCubeSeamlessLinear (const ConstPixelBufferAccess (&faceAccesses)[CUBEFACE_LAST], CubeFace baseFace, const Sampler& sampler, float s, float t, int depth)
{
	DE_ASSERT(faceAccesses[0].getWidth() == faceAccesses[0].getHeight());

	int		size	= faceAccesses[0].getWidth();
	// Non-normalized coordinates.
	float	u		= s;
	float	v		= t;

	if (sampler.normalizedCoords)
	{
		u = unnormalize(sampler.wrapS, s, size);
		v = unnormalize(sampler.wrapT, t, size);
	}

	// Get sample colors.

	Vec4 sampleColors[4];
	getCubeLinearSamples(faceAccesses, baseFace, u, v, depth, sampleColors);

	// Interpolate.

	float a = deFloatFrac(u-0.5f);
	float b = deFloatFrac(v-0.5f);

	return (sampleColors[0]*(1.0f-a)*(1.0f-b)) +
		   (sampleColors[1]*(     a)*(1.0f-b)) +
		   (sampleColors[2]*(1.0f-a)*(     b)) +
		   (sampleColors[3]*(     a)*(     b));
}